

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
::dx(FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
  *pFVar7;
  FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
  *this_00;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
  *pFVar8;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar9;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar10;
  value_type vVar11;
  value_type vVar12;
  value_type vVar13;
  double dVar14;
  
  vVar11 = FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
           ::dx(&this->left_->fadexpr_,i);
  pFVar7 = this->right_;
  this_00 = &((pFVar7->fadexpr_).right_)->fadexpr_;
  iVar5 = (this_00->left_->fadexpr_).left_.constant_;
  dVar1 = ((this_00->left_->fadexpr_).right_)->val_;
  iVar6 = (this_00->right_->fadexpr_).left_.constant_;
  dVar2 = ((this_00->right_->fadexpr_).right_)->val_;
  dVar3 = (pFVar7->fadexpr_).left_.constant_;
  vVar12 = FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
           ::dx(this_00,i);
  dVar4 = (pFVar7->fadexpr_).left_.constant_;
  vVar13 = FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
           ::val(&this->left_->fadexpr_);
  pFVar8 = (this->right_->fadexpr_).right_;
  pFVar9 = (pFVar8->fadexpr_).left_;
  pFVar10 = (pFVar8->fadexpr_).right_;
  dVar14 = ((double)(pFVar10->fadexpr_).left_.constant_ + ((pFVar10->fadexpr_).right_)->val_) *
           ((double)(pFVar9->fadexpr_).left_.constant_ + ((pFVar9->fadexpr_).right_)->val_) *
           (this->right_->fadexpr_).left_.constant_;
  return (((double)iVar6 + dVar2) * ((double)iVar5 + dVar1) * dVar3 * vVar11 -
         vVar13 * vVar12 * dVar4) / (dVar14 * dVar14);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}